

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

void ossl_closeone(Curl_easy *data,connectdata *conn,ssl_connect_data *connssl)

{
  SSL *ssl;
  char buf [32];
  undefined1 auStack_28 [32];
  
  ssl = *(SSL **)&connssl->field_0x10;
  if (ssl != (SSL *)0x0) {
    (conn->ssl[0].backend)->logger = data;
    SSL_read(ssl,auStack_28,0x20);
    SSL_shutdown(*(SSL **)&connssl->field_0x10);
    SSL_set_connect_state(*(SSL **)&connssl->field_0x10);
    SSL_free(*(SSL **)&connssl->field_0x10);
    *(undefined8 *)&connssl->field_0x10 = 0;
  }
  if ((SSL_CTX *)connssl->backend != (SSL_CTX *)0x0) {
    SSL_CTX_free((SSL_CTX *)connssl->backend);
    connssl->backend = (ssl_backend_data *)0x0;
  }
  return;
}

Assistant:

static void ossl_closeone(struct Curl_easy *data,
                          struct connectdata *conn,
                          struct ssl_connect_data *connssl)
{
  struct ssl_backend_data *backend = connssl->backend;
  if(backend->handle) {
    char buf[32];
    set_logger(conn, data);

    /* Maybe the server has already sent a close notify alert.
       Read it to avoid an RST on the TCP connection. */
    (void)SSL_read(backend->handle, buf, (int)sizeof(buf));

    (void)SSL_shutdown(backend->handle);
    SSL_set_connect_state(backend->handle);

    SSL_free(backend->handle);
    backend->handle = NULL;
  }
  if(backend->ctx) {
    SSL_CTX_free(backend->ctx);
    backend->ctx = NULL;
  }
}